

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O2

void __thiscall
asio::detail::
reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>::
reactive_socket_connect_op
          (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,
          function<void_(const_std::error_code_&)> *handler,any_io_executor *io_ex)

{
  error_category *peVar1;
  undefined4 uVar2;
  
  (this->super_reactive_socket_connect_op_base).super_reactor_op.super_operation.next_ =
       (scheduler_operation *)0x0;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.super_operation.func_ = do_complete
  ;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.super_operation.task_result_ = 0;
  uVar2 = *(undefined4 *)&success_ec->field_0x4;
  peVar1 = success_ec->_M_cat;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_value = success_ec->_M_value
  ;
  *(undefined4 *)&(this->super_reactive_socket_connect_op_base).super_reactor_op.ec_.field_0x4 =
       uVar2;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_cat = peVar1;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.cancellation_key_ = (void *)0x0;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.bytes_transferred_ = 0;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.perform_func_ =
       reactive_socket_connect_op_base::do_perform;
  (this->super_reactive_socket_connect_op_base).socket_ = socket;
  std::function<void_(const_std::error_code_&)>::function(&this->handler_,handler);
  handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>::
  handler_work(&this->work_,&this->handler_,io_ex);
  return;
}

Assistant:

reactive_socket_connect_op(const asio::error_code& success_ec,
      socket_type socket, Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_connect_op_base(success_ec, socket,
        &reactive_socket_connect_op::do_complete),
      handler_(static_cast<Handler&&>(handler)),
      work_(handler_, io_ex)
  {
  }